

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O3

int8_t __thiscall
scp::BigInt<unsigned_int,_unsigned_long>::compare
          (BigInt<unsigned_int,_unsigned_long> *this,BigInt<unsigned_int,_unsigned_long> *x)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  int8_t iVar7;
  byte bVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  
  bVar1 = this->_positive;
  if (bVar1 == true) {
    iVar7 = '\x01';
    if (x->_positive != false) {
LAB_00105298:
      puVar4 = (this->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      uVar11 = (long)puVar4 -
               (long)(this->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 2;
      puVar5 = (x->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar6 = (x->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar10 = (long)puVar6 - (long)puVar5 >> 2;
      if (uVar10 < uVar11) {
        bVar8 = bVar1 - 1;
      }
      else {
        if (uVar10 <= uVar11) {
          lVar9 = 0;
          do {
            if ((long)puVar5 - (long)puVar6 == lVar9) {
              return '\0';
            }
            uVar2 = *(uint *)((long)puVar4 + lVar9 + -4);
            uVar3 = *(uint *)((long)puVar6 + lVar9 + -4);
            lVar9 = lVar9 + -4;
          } while (uVar2 == uVar3);
          return (uVar3 < uVar2) - 1U | 1;
        }
        bVar8 = -bVar1;
      }
      return bVar8 | 1;
    }
  }
  else {
    iVar7 = -1;
    if (x->_positive == false) goto LAB_00105298;
  }
  return iVar7;
}

Assistant:

constexpr int8_t BigInt<TBase, TBuffer>::compare(const BigInt<TBase, TBuffer>& x) const
	{
		if (_positive && !x._positive)
		{
			return 1;
		}

		if (!_positive && x._positive)
		{
			return -1;
		}

		if (_values.size() > x._values.size())
		{
			if (_positive)
			{
				return 1;
			}

			return -1;
		}

		if (_values.size() < x._values.size())
		{
			if (_positive)
			{
				return -1;
			}

			return 1;
		}

		const TBase* it = _values.data() + _values.size() - 1;
		const TBase* itX = x._values.data() + x._values.size() - 1;
		const TBase* const itXEnd = x._values.data() - 1;
		while (itX != itXEnd)
		{
			if (*it != *itX)
			{
				if (*it > *itX)
				{
					return 1;
				}

				return -1;
			}

			--it;
			--itX;
		}

		return 0;
	}